

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_flush(PHYSFS_File *handle)

{
  void *pvVar1;
  long lVar2;
  int local_34;
  PHYSFS_sint64 rc;
  PHYSFS_Io *io;
  FileHandle *fh;
  PHYSFS_File *handle_local;
  
  if ((*(char *)&handle[1].opaque == '\0') && (handle[6].opaque != handle[5].opaque)) {
    pvVar1 = handle->opaque;
    lVar2 = (**(code **)((long)pvVar1 + 0x18))
                      (pvVar1,(long)handle[3].opaque + (long)handle[6].opaque,
                       (long)handle[5].opaque - (long)handle[6].opaque);
    if (lVar2 < 1) {
      handle_local._4_4_ = 0;
    }
    else {
      handle[5].opaque = (void *)0x0;
      handle[6].opaque = (void *)0x0;
      if (*(long *)((long)pvVar1 + 0x40) == 0) {
        local_34 = 1;
      }
      else {
        local_34 = (**(code **)((long)pvVar1 + 0x40))(pvVar1);
      }
      handle_local._4_4_ = local_34;
    }
  }
  else {
    handle_local._4_4_ = 1;
  }
  return handle_local._4_4_;
}

Assistant:

int PHYSFS_flush(PHYSFS_File *handle)
{
    FileHandle *fh = (FileHandle *) handle;
    PHYSFS_Io *io;
    PHYSFS_sint64 rc;

    if ((fh->forReading) || (fh->bufpos == fh->buffill))
        return 1;  /* open for read or buffer empty are successful no-ops. */

    /* dump buffer to disk. */
    io = fh->io;
    rc = io->write(io, fh->buffer + fh->bufpos, fh->buffill - fh->bufpos);
    BAIL_IF_ERRPASS(rc <= 0, 0);
    fh->bufpos = fh->buffill = 0;
    return io->flush ? io->flush(io) : 1;
}